

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplitDeque.h
# Opt level: O0

void __thiscall
HighsSplitDeque::waitForTaskToFinish(HighsSplitDeque *this,HighsTask *t,HighsSplitDeque *stealer)

{
  bool bVar1;
  unique_lock<std::mutex> *in_RDX;
  HighsBinarySemaphore *in_RSI;
  HighsSplitDeque *in_RDI;
  unique_lock<std::mutex> lg;
  unique_lock<std::mutex> *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  HighsTask *in_stack_ffffffffffffffb8;
  unique_lock<std::mutex> local_28;
  
  HighsBinarySemaphore::lockMutexForAcquire((HighsBinarySemaphore *)in_RDI);
  bVar1 = HighsTask::requestNotifyWhenFinished
                    (in_stack_ffffffffffffffb8,
                     (HighsSplitDeque *)
                     CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),in_RDI);
  if (bVar1) {
    in_stack_ffffffffffffffa0 = (unique_lock<std::mutex> *)&stack0xffffffffffffffb8;
    std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffffa0,&local_28);
    HighsBinarySemaphore::acquire(in_RSI,in_RDX);
    std::unique_lock<std::mutex>::~unique_lock(in_stack_ffffffffffffffa0);
  }
  std::unique_lock<std::mutex>::~unique_lock(in_stack_ffffffffffffffa0);
  return;
}

Assistant:

void waitForTaskToFinish(HighsTask* t, HighsSplitDeque* stealer) {
    std::unique_lock<std::mutex> lg =
        stealerData.semaphore.lockMutexForAcquire();
    // exchange the value stored in stealer with the pointer to owner
    // so that the stealer will see this pointer instead of nullptr
    // when it stores whether the task is finished. In that case the
    // stealer will additionally acquire the wait mutex and signal the owner
    // thread that the task is finished

    if (!t->requestNotifyWhenFinished(this, stealer)) return;

    stealerData.semaphore.acquire(std::move(lg));
  }